

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCuesData.cpp
# Opt level: O3

void __thiscall
libmatroska::KaxCueReference::AddReference
          (KaxCueReference *this,KaxBlockBlob *BlockReference,uint64 GlobalTimecodeScale)

{
  KaxInternalBlock *this_00;
  EbmlElement *pEVar1;
  _func_int **pp_Var2;
  
  this_00 = KaxBlockBlob::operator_cast_to_KaxInternalBlock_(BlockReference);
  pEVar1 = libebml::EbmlMaster::FindFirstElt
                     (&this->super_EbmlMaster,(EbmlCallbacks *)KaxCueRefTime::ClassInfos,true);
  pEVar1[1]._vptr_EbmlElement = (_func_int **)(this_00->Timecode / GlobalTimecodeScale);
  pEVar1->bValueIsSet = true;
  pEVar1 = libebml::EbmlMaster::FindFirstElt
                     (&this->super_EbmlMaster,(EbmlCallbacks *)KaxCueRefCluster::ClassInfos,true);
  pp_Var2 = (_func_int **)KaxInternalBlock::ClusterPosition(this_00);
  pEVar1[1]._vptr_EbmlElement = pp_Var2;
  pEVar1->bValueIsSet = true;
  return;
}

Assistant:

void KaxCueReference::AddReference(const KaxBlockBlob & BlockReference, uint64 GlobalTimecodeScale)
{
  const KaxInternalBlock & theBlock = BlockReference;
  KaxCueRefTime & NewTime = GetChild<KaxCueRefTime>(*this);
  *static_cast<EbmlUInteger*>(&NewTime) = theBlock.GlobalTimecode() / GlobalTimecodeScale;

  KaxCueRefCluster & TheClustPos = GetChild<KaxCueRefCluster>(*this);
  *static_cast<EbmlUInteger*>(&TheClustPos) = theBlock.ClusterPosition();

#ifdef OLD
  // handle recursive reference use
  if (BlockReference.ReferenceCount() != 0) {
    unsigned int i;
    for (i=0; i<BlockReference.ReferenceCount(); i++) {
      AddReference(BlockReference.Reference(i).RefBlock());
    }
  }
#endif /* OLD */
}